

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_extra_field_api.c
# Opt level: O3

zip_uint8_t *
zip_file_extra_field_get
          (zip_t *za,zip_uint64_t idx,zip_uint16_t ef_idx,zip_uint16_t *idp,zip_uint16_t *lenp,
          zip_flags_t flags)

{
  zip_uint16_t zVar1;
  int iVar2;
  zip_dirent_t *pzVar3;
  zip_extra_field_t *pzVar4;
  
  if ((flags & 0x300) == 0) {
    iVar2 = 0x12;
  }
  else {
    pzVar3 = _zip_get_dirent(za,idx,flags,&za->error);
    if ((pzVar3 == (zip_dirent_t *)0x0) ||
       (((flags >> 8 & 1) != 0 && (iVar2 = _zip_read_local_ef(za,idx), iVar2 < 0)))) {
      return (zip_uint8_t *)0x0;
    }
    pzVar4 = pzVar3->extra_fields;
    if (pzVar4 != (zip_extra_field_t *)0x0) {
      iVar2 = 0;
      do {
        if ((pzVar4->flags & flags & 0x300) != 0) {
          if ((int)(uint)ef_idx <= iVar2) {
            if (idp != (zip_uint16_t *)0x0) {
              *idp = pzVar4->id;
            }
            zVar1 = pzVar4->size;
            if (lenp != (zip_uint16_t *)0x0) {
              *lenp = zVar1;
            }
            if (zVar1 != 0) {
              return pzVar4->data;
            }
            return "";
          }
          iVar2 = iVar2 + 1;
        }
        pzVar4 = pzVar4->next;
      } while (pzVar4 != (zip_extra_field_t *)0x0);
    }
    iVar2 = 9;
  }
  zip_error_set(&za->error,iVar2,0);
  return (zip_uint8_t *)0x0;
}

Assistant:

ZIP_EXTERN const zip_uint8_t *
zip_file_extra_field_get(zip_t *za, zip_uint64_t idx, zip_uint16_t ef_idx, zip_uint16_t *idp, zip_uint16_t *lenp, zip_flags_t flags) {
    static const zip_uint8_t empty[1] = {'\0'};

    zip_dirent_t *de;
    zip_extra_field_t *ef;
    int i;

    if ((flags & ZIP_EF_BOTH) == 0) {
	zip_error_set(&za->error, ZIP_ER_INVAL, 0);
	return NULL;
    }

    if ((de = _zip_get_dirent(za, idx, flags, &za->error)) == NULL)
	return NULL;

    if (flags & ZIP_FL_LOCAL)
	if (_zip_read_local_ef(za, idx) < 0)
	    return NULL;

    i = 0;
    for (ef = de->extra_fields; ef; ef = ef->next) {
	if (ef->flags & flags & ZIP_EF_BOTH) {
	    if (i < ef_idx) {
		i++;
		continue;
	    }

	    if (idp)
		*idp = ef->id;
	    if (lenp)
		*lenp = ef->size;
	    if (ef->size > 0)
		return ef->data;
	    else
		return empty;
	}
    }

    zip_error_set(&za->error, ZIP_ER_NOENT, 0);
    return NULL;
}